

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntryReverse(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  CallInfo CVar2;
  code *pcVar3;
  uint64 pArr_00;
  JavascriptArray *obj_00;
  bool bVar4;
  bool bVar5;
  uint32 length_00;
  undefined4 *puVar6;
  Var pvVar7;
  uint64 length_01;
  int in_stack_00000010;
  undefined1 local_80 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  JsReentLock jsReentLock;
  BigIndex length;
  JavascriptArray *pArr;
  RecyclableObject *obj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x15a5,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00a49f02;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_80,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  CVar2 = (CallInfo)pSVar1->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  bVar4 = *(bool *)((long)CVar2 + 0x108);
  *(bool *)((long)CVar2 + 0x108) = true;
  callInfo_local = CVar2;
  jsReentLock.m_arrayObject2._0_1_ = bVar4;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x15a9,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) {
LAB_00a49f02:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  if ((local_80._0_4_ & 0xffffff) != 0) {
    BigIndex::BigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,0);
    length.bigIndex = 0;
    pArr = (JavascriptArray *)0x0;
    *(bool *)((long)CVar2 + 0x108) = bVar4;
    pvVar7 = Arguments::operator[]((Arguments *)local_80,0);
    TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
              (pvVar7,pSVar1,L"Array.prototype.reverse",(JavascriptArray **)&length.bigIndex,
               (RecyclableObject **)&pArr,(BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
    JsReentLock::MutateArrayObject((JsReentLock *)&callInfo_local);
    obj_00 = pArr;
    pArr_00 = length.bigIndex;
    *(undefined1 *)((long)callInfo_local + 0x108) = 1;
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if (jsReentLock._24_4_ == -1) {
      length_01 = BigIndex::GetBigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
      pvVar7 = ReverseHelper<unsigned_long>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_01,pSVar1);
    }
    else {
      length_00 = BigIndex::GetSmallIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy);
      pvVar7 = ReverseHelper<unsigned_int>
                         ((JavascriptArray *)pArr_00,(TypedArrayBase *)0x0,
                          (RecyclableObject *)obj_00,length_00,pSVar1);
    }
    *(undefined1 *)((long)callInfo_local + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    return pvVar7;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.reverse");
}

Assistant:

Var JavascriptArray::EntryReverse(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Reverse);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.reverse"));
        }

        BigIndex length = 0u;
        JavascriptArray* pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.reverse"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReverseHelper(pArr, nullptr, obj, length.GetSmallIndex(), scriptContext));
        }

        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::ReverseHelper(pArr, nullptr, obj, length.GetBigIndex(), scriptContext));
        JIT_HELPER_END(Array_Reverse);
    }